

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * flatbuffers::GenerateTextImpl
                 (Parser *parser,Table *table,StructDef *struct_def,string *_text)

{
  char *err;
  JsonPrinter printer;
  string *_text_local;
  StructDef *struct_def_local;
  Table *table_local;
  Parser *parser_local;
  
  printer.text = _text;
  JsonPrinter::JsonPrinter((JsonPrinter *)&err,parser,_text);
  parser_local = (Parser *)JsonPrinter::GenStruct((JsonPrinter *)&err,struct_def,table,0);
  if (parser_local == (Parser *)0x0) {
    JsonPrinter::AddNewLine((JsonPrinter *)&err);
    parser_local = (Parser *)0x0;
  }
  return (char *)parser_local;
}

Assistant:

static const char *GenerateTextImpl(const Parser &parser, const Table *table,
                                    const StructDef &struct_def,
                                    std::string *_text) {
  JsonPrinter printer(parser, *_text);
  auto err = printer.GenStruct(struct_def, table, 0);
  if (err) return err;
  printer.AddNewLine();
  return nullptr;
}